

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QAbstractTextDocumentLayout::Selection>::copyAppend
          (QGenericArrayOps<QAbstractTextDocumentLayout::Selection> *this,Selection *b,Selection *e)

{
  Selection *this_00;
  ulong in_RDX;
  ulong in_RSI;
  Selection *in_RDI;
  Selection *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::begin
                        ((QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *)0x816c17);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QAbstractTextDocumentLayout::Selection::Selection(this_00,in_RDI);
      local_10 = local_10 + 0x18;
      *(long *)&(in_RDI->format).super_QTextFormat.format_type =
           *(long *)&(in_RDI->format).super_QTextFormat.format_type + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }